

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Cnf_AddCardinConstrMerge(sat_solver *p,int *pVars,int lo,int hi,int r,int *pnVars)

{
  int r_00;
  int lo_00;
  
  r_00 = r * 2;
  if (r_00 < hi - lo) {
    Cnf_AddCardinConstrMerge(p,pVars,lo,hi - r,r_00,pnVars);
    lo_00 = r + lo;
    Cnf_AddCardinConstrMerge(p,pVars,lo_00,hi,r_00,pnVars);
    for (; lo = lo + r_00, lo_00 < hi - r; lo_00 = lo_00 + r_00) {
      Cnf_AddSorder(p,pVars,lo_00,lo,pnVars);
    }
  }
  return;
}

Assistant:

static inline void Cnf_AddCardinConstrMerge( sat_solver * p, int * pVars, int lo, int hi, int r, int * pnVars )
{
    int i, step = r * 2;
    if ( step < hi - lo )
    {
        Cnf_AddCardinConstrMerge( p, pVars, lo, hi-r, step, pnVars );
        Cnf_AddCardinConstrMerge( p, pVars, lo+r, hi, step, pnVars );
        for ( i = lo+r; i < hi-r; i += step )
            Cnf_AddSorder( p, pVars, i, i+r, pnVars );
    }
}